

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void bitrv2conj(int n,int *ip,double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  double *pdVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  
  *ip = 0;
  if (n < 9) {
    uVar10 = 2;
    uVar7 = 2;
    uVar6 = 1;
    if (n != 8) goto LAB_0010a600;
  }
  else {
    uVar6 = 1;
    do {
      uVar5 = uVar6;
      n = (uint)n >> 1;
      if (0 < (int)uVar5) {
        uVar10 = 0;
        do {
          ip[uVar5 + uVar10] = ip[uVar10] + n;
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar10);
      }
      uVar6 = uVar5 * 2;
    } while ((int)(uVar5 * 0x10) < n);
    uVar7 = uVar5 << 2;
    uVar10 = (ulong)uVar7;
    if (uVar5 * 0x10 != n) {
LAB_0010a600:
      a[1] = -a[1];
      uVar7 = (uint)uVar10;
      a[(int)(uVar7 | 1)] = -a[(int)(uVar7 | 1)];
      if ((int)uVar6 < 2) {
        return;
      }
      uVar11 = 1;
      lVar16 = 4;
      do {
        lVar14 = (long)ip[uVar11];
        lVar4 = lVar14 * 8 + uVar10 * 8 + 8;
        lVar15 = lVar14 * 8;
        lVar19 = (long)((int)uVar11 * 2);
        lVar17 = 0;
        do {
          lVar18 = *(int *)((long)ip + lVar17) + lVar19;
          dVar1 = *(double *)((long)a + lVar17 * 4 + lVar15);
          dVar2 = *(double *)((long)a + lVar17 * 4 + lVar15 + 8);
          dVar3 = a[lVar18 + 1];
          *(double *)((long)a + lVar17 * 4 + lVar15) = a[lVar18];
          *(double *)((long)a + lVar17 * 4 + lVar15 + 8) = -dVar3;
          a[lVar18] = dVar1;
          a[lVar18 + 1] = -dVar2;
          dVar1 = *(double *)((long)a + lVar17 * 4 + lVar4 + -8);
          dVar2 = *(double *)((long)a + lVar17 * 4 + lVar4);
          lVar18 = (long)(int)((int)lVar18 + uVar7);
          dVar3 = a[lVar18 + 1];
          *(double *)((long)a + lVar17 * 4 + lVar4 + -8) = a[lVar18];
          *(double *)((long)a + lVar17 * 4 + lVar4) = -dVar3;
          a[lVar18] = dVar1;
          a[lVar18 + 1] = -dVar2;
          lVar17 = lVar17 + 4;
        } while (lVar16 != lVar17);
        lVar14 = lVar14 + lVar19;
        a[lVar14 + 1] = -a[lVar14 + 1];
        lVar15 = (long)(int)((int)lVar14 + uVar7);
        a[lVar15 + 1] = -a[lVar15 + 1];
        uVar11 = uVar11 + 1;
        lVar16 = lVar16 + 4;
      } while (uVar11 != uVar6);
      return;
    }
    if ((int)uVar6 < 1) {
      return;
    }
  }
  uVar10 = (ulong)uVar7;
  uVar11 = 0;
  do {
    iVar12 = 0;
    if (uVar11 != 0) {
      iVar13 = ip[uVar11];
      iVar12 = (int)uVar11 * 2;
      pdVar8 = a + iVar13;
      uVar20 = 0;
      do {
        lVar16 = (long)ip[uVar20] + (long)iVar12;
        dVar1 = *pdVar8;
        dVar2 = pdVar8[1];
        dVar3 = a[lVar16 + 1];
        *pdVar8 = a[lVar16];
        pdVar8[1] = -dVar3;
        a[lVar16] = dVar1;
        a[lVar16 + 1] = -dVar2;
        iVar9 = (int)lVar16 + uVar6 * 4;
        dVar1 = pdVar8[uVar10];
        dVar2 = pdVar8[uVar10 + 1];
        dVar3 = a[(long)iVar9 + 1];
        pdVar8[uVar10] = a[iVar9];
        pdVar8[uVar10 + 1] = -dVar3;
        a[iVar9] = dVar1;
        a[(long)iVar9 + 1] = -dVar2;
        iVar9 = iVar9 - uVar7;
        dVar1 = pdVar8[uVar10 * 2];
        dVar2 = pdVar8[uVar10 * 2 + 1];
        dVar3 = a[(long)iVar9 + 1];
        pdVar8[uVar10 * 2] = a[iVar9];
        pdVar8[uVar10 * 2 + 1] = -dVar3;
        a[iVar9] = dVar1;
        a[(long)iVar9 + 1] = -dVar2;
        dVar1 = pdVar8[uVar10 * 3];
        dVar2 = pdVar8[uVar10 * 3 + 1];
        lVar16 = (long)(int)(iVar9 + uVar6 * 4);
        dVar3 = a[lVar16 + 1];
        pdVar8[uVar10 * 3] = a[lVar16];
        pdVar8[uVar10 * 3 + 1] = -dVar3;
        a[lVar16] = dVar1;
        a[lVar16 + 1] = -dVar2;
        uVar20 = uVar20 + 1;
        pdVar8 = pdVar8 + 2;
      } while (uVar11 != uVar20);
      iVar12 = iVar12 + iVar13;
    }
    a[(long)iVar12 + 1] = -a[(long)iVar12 + 1];
    iVar12 = iVar12 + uVar7;
    iVar13 = iVar12 + uVar7;
    dVar1 = a[iVar12];
    dVar2 = a[(long)iVar12 + 1];
    dVar3 = a[(long)iVar13 + 1];
    a[iVar12] = a[iVar13];
    a[(long)iVar12 + 1] = -dVar3;
    a[iVar13] = dVar1;
    a[(long)iVar13 + 1] = -dVar2;
    a[(long)(int)(iVar13 + uVar7) + 1] = -a[(long)(int)(iVar13 + uVar7) + 1];
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar6);
  return;
}

Assistant:

void bitrv2conj(int n, int *ip, double *a)
{
    int j, j1, k, k1, l, m, m2;
    double xr, xi, yr, yi;
    
    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 2 * k + ip[k];
            a[k1 + 1] = -a[k1 + 1];
            j1 = k1 + m2;
            k1 = j1 + m2;
            xr = a[j1];
            xi = -a[j1 + 1];
            yr = a[k1];
            yi = -a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            k1 += m2;
            a[k1 + 1] = -a[k1 + 1];
        }
    } else {
        a[1] = -a[1];
        a[m2 + 1] = -a[m2 + 1];
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 2 * k + ip[k];
            a[k1 + 1] = -a[k1 + 1];
            a[k1 + m2 + 1] = -a[k1 + m2 + 1];
        }
    }
}